

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
::ExportConStatus(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>_>
                  *this,int i_con,Container *cnt,ItemNamer *vnam,bool add2final)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar5;
  Buffer<char> *pBVar6;
  int iVar7;
  _func_int **pp_Var8;
  size_t size;
  size_t sVar9;
  BasicLogger *pBVar10;
  undefined3 in_register_00000081;
  char *str;
  size_t new_size;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter pr;
  MemoryWriter wrt;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4c8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_4b0;
  undefined4 local_49c;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_498;
  BasicMemoryWriter<char,_std::allocator<char>_> local_488;
  BasicMemoryWriter<char,_std::allocator<char>_> local_258;
  
  local_49c = CONCAT31(in_register_00000081,add2final);
  pBVar10 = (this->super_BasicConstraintKeeper).exporter_;
  if (pBVar10 == (BasicLogger *)0x0) {
    return;
  }
  iVar7 = (*pBVar10->_vptr_BasicLogger[2])();
  if ((char)iVar7 == '\0') {
    return;
  }
  if ((this->super_BasicConstraintKeeper).exporter_ == (BasicLogger *)0x0) {
    return;
  }
  local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
  local_258.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00445660;
  local_258.buffer_.super_Buffer<char>.ptr_ = local_258.buffer_.data_;
  local_258.buffer_.super_Buffer<char>.size_ = 0;
  local_258.buffer_.super_Buffer<char>.capacity_ = 500;
  local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004456a8;
  local_4b0.wrt_ = &local_258;
  local_4b0.kind_ = Unset;
  local_4b0.n_written_ = 0;
  pp_Var8 = (_func_int **)
            BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
  key._M_str = (char *)0x8;
  key._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_4c8,key);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = pp_Var8;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x37fc95,(void *)0xa,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  key_00._M_str = (char *)0x5;
  key_00._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_00);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(uint)i_con;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x391805,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  pp_Var8 = (_func_int **)(cnt->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
  if (*(char *)pp_Var8 == '\0') goto LAB_00282d1f;
  key_01._M_str = (char *)0x4;
  key_01._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_01);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = pp_Var8;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x37fc95,(void *)0xa,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  local_488.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00445660;
  local_488.buffer_.super_Buffer<char>.ptr_ = local_488.buffer_.data_;
  local_488.buffer_.super_Buffer<char>.size_ = 0;
  local_488.buffer_.super_Buffer<char>.capacity_ = 500;
  local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004456a8;
  pcVar4 = (cnt->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
  local_488.super_BasicWriter<char>.buffer_ = &local_488.buffer_.super_Buffer<char>;
  size = strlen(pcVar4);
  if (size < 0x1f5) {
    if (size != 0) goto LAB_00282c02;
  }
  else {
    fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow(&local_488.buffer_,size);
LAB_00282c02:
    memmove(local_488.buffer_.super_Buffer<char>.ptr_ + local_488.buffer_.super_Buffer<char>.size_,
            pcVar4,size);
  }
  pBVar6 = local_488.super_BasicWriter<char>.buffer_;
  sVar9 = (local_488.super_BasicWriter<char>.buffer_)->size_;
  uVar1 = sVar9 + 2;
  local_488.buffer_.super_Buffer<char>.size_ = size;
  if ((local_488.super_BasicWriter<char>.buffer_)->capacity_ < uVar1) {
    (**((Buffer<char> *)&(local_488.super_BasicWriter<char>.buffer_)->_vptr_Buffer)->_vptr_Buffer)
              (local_488.super_BasicWriter<char>.buffer_,uVar1);
    sVar9 = pBVar6->size_;
  }
  pcVar4 = pBVar6->ptr_;
  (pcVar4 + sVar9)[0] = ':';
  (pcVar4 + sVar9)[1] = ' ';
  pBVar6->size_ = uVar1;
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
            (&local_488,
             (IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
              *)cnt,vnam);
  sVar9 = (local_488.super_BasicWriter<char>.buffer_)->size_;
  if ((local_488.super_BasicWriter<char>.buffer_)->capacity_ < sVar9 + 1) {
    (**((Buffer<char> *)&(local_488.super_BasicWriter<char>.buffer_)->_vptr_Buffer)->_vptr_Buffer)()
    ;
  }
  (local_488.super_BasicWriter<char>.buffer_)->ptr_[sVar9] = '\0';
  pBVar5 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
           (local_488.super_BasicWriter<char>.buffer_)->ptr_;
  key_02._M_str = (char *)0x7;
  key_02._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_498,key_02);
  if (local_498.kind_ == Unset) {
    local_498.kind_ = Scalar;
  }
  local_4c8.wrt_ = pBVar5;
  fmt::BasicWriter<char>::write
            (&(local_498.wrt_)->super_BasicWriter<char>,0x37fc95,(void *)0xa,(size_t)&local_4c8);
  local_498.n_written_ = local_498.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_498);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_498);
  local_488.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00445660;
  local_488.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004456a8;
  if (local_488.buffer_.super_Buffer<char>.ptr_ != local_488.buffer_.data_) {
    operator_delete(local_488.buffer_.super_Buffer<char>.ptr_,
                    local_488.buffer_.super_Buffer<char>.capacity_);
  }
LAB_00282d1f:
  uVar3 = cnt->depth_;
  key_03._M_str = (char *)0x5;
  key_03._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_03);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)uVar3;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x391805,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  cVar2 = cnt->is_unused_;
  key_04._M_str = (char *)0x6;
  key_04._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_04);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(cVar2 != '\0');
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x391805,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  cVar2 = cnt->is_bridged_;
  key_05._M_str = (char *)0x7;
  key_05._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_05);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(cVar2 != '\0');
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x391805,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  key_06._M_str = (char *)0x5;
  key_06._M_len = (size_t)&local_4b0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (&local_4c8,key_06);
  if (local_4c8.kind_ == Unset) {
    local_4c8.kind_ = Scalar;
  }
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)(ulong)(byte)local_49c;
  fmt::BasicWriter<char>::write
            (&(local_4c8.wrt_)->super_BasicWriter<char>,0x391805,(void *)0x2,(size_t)&local_488);
  local_4c8.n_written_ = local_4c8.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4c8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_4b0);
  local_488.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)0x0;
  local_488.super_BasicWriter<char>.buffer_ = (Buffer<char> *)0x0;
  fmt::BasicWriter<char>::write
            (&local_258.super_BasicWriter<char>,0x38d553,(void *)0x0,(size_t)&local_488);
  pBVar10 = (this->super_BasicConstraintKeeper).exporter_;
  if ((pBVar10 == (BasicLogger *)0x0) ||
     (iVar7 = (*pBVar10->_vptr_BasicLogger[2])(), (char)iVar7 == '\0')) {
    pBVar10 = (BasicLogger *)0x0;
  }
  else {
    pBVar10 = (this->super_BasicConstraintKeeper).exporter_;
  }
  BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar10,&local_258);
  local_258.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00445660;
  local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004456a8;
  if (local_258.buffer_.super_Buffer<char>.ptr_ != local_258.buffer_.data_) {
    operator_delete(local_258.buffer_.super_Buffer<char>.ptr_,
                    local_258.buffer_.super_Buffer<char>.capacity_);
  }
  return;
}

Assistant:

void ExportConStatus(int i_con, const Container& cnt,
                       ItemNamer& vnam, bool add2final) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["index"] = i_con;
        if (*cnt.GetCon().name()) {
          jw["name"] = cnt.GetCon().name();
          {
            fmt::MemoryWriter pr;
            WriteFlatCon(pr, cnt.GetCon(), vnam);
            jw["printed"] = pr.c_str();
          }
        }
        jw["depth"] = cnt.GetDepth();
        jw["unused"] = (int)cnt.IsUnused();
        jw["bridged"] = (int)cnt.IsBridged();
        jw["final"] = (int)add2final;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }